

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

ChMatrix33<double> * __thiscall
chrono::fea::ChElementBeamANCF_3243::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementBeamANCF_3243 *this,double xi,
          double eta,double zeta)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChMaterialBeamANCF *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  Matrix3xN *pMVar21;
  double *pdVar22;
  Index row;
  long lVar23;
  undefined1 (*pauVar24) [64];
  ActualDstType actualDst;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  double dVar44;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D;
  ChMatrixNM<double,_6,_6> D;
  Matrix3xN e_bar;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [8];
  double adStack_4c8 [7];
  double local_490;
  double dStack_488;
  double local_480 [2];
  double local_470 [4];
  double dStack_450;
  double local_448;
  double local_440;
  double dStack_438;
  double local_430;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  double local_3f0;
  double dStack_3e8;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  double local_3c0;
  double dStack_3b8;
  double local_3b0;
  double dStack_3a8;
  double local_3a0;
  double adStack_398 [2];
  Matrix<double,_3,_3,_1,_3,_3> local_388;
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [16];
  double dStack_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double *pdStack_230;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_228;
  double dStack_220;
  undefined1 auStack_218 [24];
  undefined1 local_200 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pdVar22 = (double *)local_340;
  Calc_Sxi_D(this,(MatrixNx3c *)pdVar22,xi,eta,zeta);
  pMVar21 = &this->m_ebar0;
  lVar23 = 0x10;
  do {
    auVar32 = *(undefined1 (*) [64])
               (pMVar21->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array;
    pMVar21 = (Matrix3xN *)
              ((pMVar21->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array + 8);
    auVar30 = vmulpd_avx512f(auVar32,local_340);
    auVar27 = vextractf64x4_avx512f(auVar30,1);
    auVar31 = vmulpd_avx512f(auVar32,local_300);
    auVar32 = vmulpd_avx512f(auVar32,local_2c0);
    auVar28 = vextractf64x4_avx512f(auVar31,1);
    auVar29 = vextractf64x4_avx512f(auVar32,1);
    *(double *)((long)adStack_398 + lVar23) =
         auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
         auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
    *(double *)((long)adStack_398 + lVar23 + 8) =
         auVar31._0_8_ + auVar28._0_8_ + auVar31._8_8_ + auVar28._8_8_ +
         auVar31._16_8_ + auVar28._16_8_ + auVar31._24_8_ + auVar28._24_8_;
    dVar40 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
    dVar44 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
    auVar41._0_8_ = dVar40 + dVar44;
    auVar41._8_8_ = dVar40 + dVar44;
    uVar3 = vmovlpd_avx(auVar41);
    *(undefined8 *)
     ((long)local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + lVar23) = uVar3;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  local_140._8_8_ = &local_388;
  local_280._0_8_ = pdVar22;
  local_140._0_8_ = pdVar22;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_280 + 8),(SrcXprType *)(local_140 + 8),
        (assign_op<double,_double> *)local_470);
  pdStack_230 = (double *)local_280._0_8_;
  dStack_220 = 1.48219693752374e-323;
  auVar32 = *(undefined1 (*) [64])local_280._0_8_;
  auVar30 = *(undefined1 (*) [64])(local_280._0_8_ + 0x40);
  auVar31 = *(undefined1 (*) [64])(local_280._0_8_ + 0x80);
  auVar33._8_8_ = local_280._8_8_;
  auVar33._0_8_ = local_280._8_8_;
  auVar33._16_8_ = local_280._8_8_;
  auVar33._24_8_ = local_280._8_8_;
  auVar33._32_8_ = local_280._8_8_;
  auVar33._40_8_ = local_280._8_8_;
  auVar33._48_8_ = local_280._8_8_;
  auVar33._56_8_ = local_280._8_8_;
  auVar33 = vmulpd_avx512f(auVar32,auVar33);
  auVar34._8_8_ = dStack_270;
  auVar34._0_8_ = dStack_270;
  auVar34._16_8_ = dStack_270;
  auVar34._24_8_ = dStack_270;
  auVar34._32_8_ = dStack_270;
  auVar34._40_8_ = dStack_270;
  auVar34._48_8_ = dStack_270;
  auVar34._56_8_ = dStack_270;
  auVar34 = vmulpd_avx512f(auVar32,auVar34);
  auVar35._8_8_ = dStack_268;
  auVar35._0_8_ = dStack_268;
  auVar35._16_8_ = dStack_268;
  auVar35._24_8_ = dStack_268;
  auVar35._32_8_ = dStack_268;
  auVar35._40_8_ = dStack_268;
  auVar35._48_8_ = dStack_268;
  auVar35._56_8_ = dStack_268;
  auVar35 = vmulpd_avx512f(auVar32,auVar35);
  auVar32._8_8_ = dStack_260;
  auVar32._0_8_ = dStack_260;
  auVar32._16_8_ = dStack_260;
  auVar32._24_8_ = dStack_260;
  auVar32._32_8_ = dStack_260;
  auVar32._40_8_ = dStack_260;
  auVar32._48_8_ = dStack_260;
  auVar32._56_8_ = dStack_260;
  auVar32 = vfmadd231pd_avx512f(auVar33,auVar30,auVar32);
  auVar8._8_8_ = dStack_258;
  auVar8._0_8_ = dStack_258;
  auVar8._16_8_ = dStack_258;
  auVar8._24_8_ = dStack_258;
  auVar8._32_8_ = dStack_258;
  auVar8._40_8_ = dStack_258;
  auVar8._48_8_ = dStack_258;
  auVar8._56_8_ = dStack_258;
  auVar33 = vfmadd231pd_avx512f(auVar34,auVar30,auVar8);
  auVar9._8_8_ = dStack_250;
  auVar9._0_8_ = dStack_250;
  auVar9._16_8_ = dStack_250;
  auVar9._24_8_ = dStack_250;
  auVar9._32_8_ = dStack_250;
  auVar9._40_8_ = dStack_250;
  auVar9._48_8_ = dStack_250;
  auVar9._56_8_ = dStack_250;
  auVar34 = vfmadd231pd_avx512f(auVar35,auVar30,auVar9);
  auVar30._8_8_ = dStack_248;
  auVar30._0_8_ = dStack_248;
  auVar30._16_8_ = dStack_248;
  auVar30._24_8_ = dStack_248;
  auVar30._32_8_ = dStack_248;
  auVar30._40_8_ = dStack_248;
  auVar30._48_8_ = dStack_248;
  auVar30._56_8_ = dStack_248;
  local_340 = vfmadd231pd_avx512f(auVar32,auVar31,auVar30);
  auVar10._8_8_ = local_240;
  auVar10._0_8_ = local_240;
  auVar10._16_8_ = local_240;
  auVar10._24_8_ = local_240;
  auVar10._32_8_ = local_240;
  auVar10._40_8_ = local_240;
  auVar10._48_8_ = local_240;
  auVar10._56_8_ = local_240;
  local_300 = vfmadd231pd_avx512f(auVar33,auVar31,auVar10);
  auVar11._8_8_ = dStack_238;
  auVar11._0_8_ = dStack_238;
  auVar11._16_8_ = dStack_238;
  auVar11._24_8_ = dStack_238;
  auVar11._32_8_ = dStack_238;
  auVar11._40_8_ = dStack_238;
  auVar11._48_8_ = dStack_238;
  auVar11._56_8_ = dStack_238;
  local_2c0 = vfmadd231pd_avx512f(auVar34,auVar31,auVar11);
  pMStack_228 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_280 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_140);
  auVar31._8_8_ = local_140._8_8_;
  auVar31._0_8_ = local_140._0_8_;
  auVar31._16_48_ = local_140._16_48_;
  lVar23 = 0x10;
  do {
    auVar32 = *(undefined1 (*) [64])pdVar22;
    pdVar22 = pdVar22 + 8;
    auVar30 = vmulpd_avx512f(auVar31,auVar32);
    auVar27 = vextractf64x4_avx512f(auVar30,1);
    auVar33 = vmulpd_avx512f(auVar32,local_100);
    auVar32 = vmulpd_avx512f(auVar32,local_c0);
    auVar28 = vextractf64x4_avx512f(auVar33,1);
    auVar29 = vextractf64x4_avx512f(auVar32,1);
    *(double *)((long)local_480 + lVar23) =
         auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
         auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
    *(double *)((long)local_480 + lVar23 + 8) =
         auVar33._0_8_ + auVar28._0_8_ + auVar33._8_8_ + auVar28._8_8_ +
         auVar33._16_8_ + auVar28._16_8_ + auVar33._24_8_ + auVar28._24_8_;
    dVar40 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
    dVar44 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
    auVar25._0_8_ = dVar40 + dVar44;
    auVar25._8_8_ = dVar40 + dVar44;
    uVar3 = vmovlpd_avx(auVar25);
    *(undefined8 *)((long)local_470 + lVar23) = uVar3;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  auVar18._8_8_ = local_470[3];
  auVar18._0_8_ = local_470[2];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_448;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_430;
  auVar41 = vunpcklpd_avx(auVar18,auVar47);
  auVar36._0_8_ =
       auVar41._0_8_ * auVar41._0_8_ + local_470[0] * local_470[0] + local_470[1] * local_470[1];
  auVar36._8_8_ =
       auVar41._8_8_ * auVar41._8_8_ + local_470[3] * local_470[3] + dStack_450 * dStack_450;
  auVar6._8_8_ = 0xbff0000000000000;
  auVar6._0_8_ = 0xbff0000000000000;
  auVar25 = vaddpd_avx512vl(auVar36,auVar6);
  auVar26._8_8_ = 0x3fe0000000000000;
  auVar26._0_8_ = 0x3fe0000000000000;
  _local_4d0 = vmulpd_avx512vl(auVar25,auVar26);
  auVar25 = vunpcklpd_avx(auVar49,auVar47);
  local_4e0._8_8_ =
       local_470[2] * auVar25._8_8_ + local_470[0] * local_470[3] + local_470[1] * dStack_450;
  local_4e0._0_8_ =
       local_470[2] * auVar25._0_8_ + local_470[0] * local_440 + local_470[1] * dStack_438;
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (local_430 * local_430 + local_440 * local_440 + dStack_438 * dStack_438 + -1.0) * 0.5;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_448 * local_430 + local_470[3] * local_440 + dStack_450 * dStack_438;
  if (this->m_damping_enabled == true) {
    local_3f0 = local_470[2];
    dStack_3e8 = local_470[2];
    local_3c0 = local_440;
    dStack_3b8 = dStack_438;
    local_3b0 = local_470[3];
    dStack_3a8 = dStack_450;
    local_3a0 = local_470[0];
    adStack_398[0] = local_470[1];
    local_420 = auVar52;
    local_410 = auVar41;
    local_400 = auVar51;
    local_3e0 = auVar25;
    local_3d0 = auVar49;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_280);
    auVar19._8_8_ = local_280._8_8_;
    auVar19._0_8_ = local_280._0_8_;
    auVar19._16_8_ = dStack_270;
    auVar19._24_8_ = dStack_268;
    auVar19._32_8_ = dStack_260;
    auVar19._40_8_ = dStack_258;
    auVar19._48_8_ = dStack_250;
    auVar19._56_8_ = dStack_248;
    auVar20._8_8_ = dStack_238;
    auVar20._0_8_ = local_240;
    auVar20._16_8_ = pdStack_230;
    auVar20._24_8_ = pMStack_228;
    auVar20._32_8_ = dStack_220;
    auVar20._40_24_ = auStack_218;
    lVar23 = 0x10;
    pauVar24 = &local_340;
    do {
      auVar32 = *pauVar24;
      pauVar24 = pauVar24 + 1;
      auVar30 = vmulpd_avx512f(auVar19,auVar32);
      auVar27 = vextractf64x4_avx512f(auVar30,1);
      auVar31 = vmulpd_avx512f(auVar32,auVar20);
      auVar32 = vmulpd_avx512f(auVar32,local_200);
      auVar28 = vextractf64x4_avx512f(auVar31,1);
      auVar29 = vextractf64x4_avx512f(auVar32,1);
      *(double *)(local_4d0 + lVar23) =
           auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
           auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
      *(double *)(local_4d0 + lVar23 + 8) =
           auVar31._0_8_ + auVar28._0_8_ + auVar31._8_8_ + auVar28._8_8_ +
           auVar31._16_8_ + auVar28._16_8_ + auVar31._24_8_ + auVar28._24_8_;
      dVar40 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
      dVar44 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
      auVar42._0_8_ = dVar40 + dVar44;
      auVar42._8_8_ = dVar40 + dVar44;
      uVar3 = vmovlpd_avx(auVar42);
      *(undefined8 *)((long)adStack_4c8 + lVar23 + 8) = uVar3;
      lVar23 = lVar23 + 0x18;
    } while (lVar23 != 0x58);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = adStack_4c8[6];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_480[0];
    auVar15._8_8_ = adStack_4c8[4];
    auVar15._0_8_ = adStack_4c8[3];
    auVar41 = vunpcklpd_avx(auVar15,auVar45);
    auVar39._0_8_ =
         auVar41._0_8_ * (double)local_410._0_8_ +
         local_3a0 * adStack_4c8[1] + adStack_398[0] * adStack_4c8[2];
    auVar39._8_8_ =
         auVar41._8_8_ * (double)local_410._8_8_ +
         local_3b0 * adStack_4c8[4] + dStack_3a8 * adStack_4c8[5];
    auVar43._8_8_ = this->m_Alpha;
    auVar43._0_8_ = this->m_Alpha;
    _local_4d0 = vfmadd231pd_fma(_local_4d0,auVar43,auVar39);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_420._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         (double)local_3d0._0_8_ * local_480[0] + local_3c0 * local_490 + dStack_3b8 * dStack_488;
    auVar25 = vfmadd213sd_fma(auVar46,auVar43,auVar4);
    auVar41 = vunpcklpd_avx(auVar48,auVar45);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_400._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         local_480[0] * local_448 + local_3b0 * local_490 + dStack_3a8 * dStack_488 +
         (double)local_3d0._0_8_ * adStack_4c8[6] +
         local_3c0 * adStack_4c8[4] + dStack_3b8 * adStack_4c8[5];
    auVar6 = vfmadd213sd_fma(auVar50,auVar43,auVar5);
    auVar7._8_8_ = adStack_4c8[3];
    auVar7._0_8_ = adStack_4c8[3];
    auVar26 = vmulpd_avx512vl(local_3e0,auVar7);
    local_4f0 = vunpcklpd_avx(auVar25,auVar6);
    auVar37._0_8_ =
         auVar26._0_8_ + local_3c0 * adStack_4c8[1] + dStack_3b8 * adStack_4c8[2] +
         auVar41._0_8_ * local_3f0 + local_3a0 * local_490 + adStack_398[0] * dStack_488;
    auVar37._8_8_ =
         auVar26._8_8_ + local_3b0 * adStack_4c8[1] + dStack_3a8 * adStack_4c8[2] +
         auVar41._8_8_ * dStack_3e8 + local_3a0 * adStack_4c8[4] + adStack_398[0] * adStack_4c8[5];
    local_4e0 = vfmadd231pd_fma(local_4e0,auVar43,auVar37);
  }
  else {
    local_4f0 = vunpcklpd_avx(auVar52,auVar51);
  }
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  ChMaterialBeamANCF::Get_D(this_00,(ChMatrixNM<double,_6,_6> *)local_280);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pdVar22 = &dStack_260;
  lVar23 = 0;
  do {
    pdVar1 = pdVar22 + -2;
    pdVar12 = pdVar22 + -1;
    dVar40 = *pdVar22;
    pdVar13 = pdVar22 + 1;
    pdVar2 = pdVar22 + -4;
    pdVar14 = pdVar22 + -3;
    pdVar22 = pdVar22 + 6;
    dVar40 = (double)local_4d0 * *pdVar2 +
             (double)local_4f0._0_8_ * *pdVar1 + (double)local_4e0._0_8_ * dVar40;
    dVar44 = adStack_4c8[0] * *pdVar14 +
             (double)local_4f0._8_8_ * *pdVar12 + (double)local_4e0._8_8_ * *pdVar13;
    auVar38._0_8_ = dVar40 + dVar44;
    auVar38._8_8_ = dVar40 + dVar44;
    dVar40 = (double)vmovlpd_avx(auVar38);
    adStack_4c8[lVar23 + 1] = dVar40;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 6);
  auVar17._8_8_ = adStack_4c8[6];
  auVar17._0_8_ = adStack_4c8[5];
  auVar27._8_8_ = adStack_4c8[3];
  auVar27._0_8_ = adStack_4c8[3];
  auVar27._16_8_ = adStack_4c8[3];
  auVar27._24_8_ = adStack_4c8[3];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       adStack_4c8[1];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       adStack_4c8[2];
  auVar16._8_8_ = adStack_4c8[5];
  auVar16._0_8_ = adStack_4c8[4];
  auVar41 = vunpcklpd_avx(auVar16,auVar17);
  auVar27 = vblendpd_avx(ZEXT1632(auVar41),auVar27,8);
  auVar27 = vpermpd_avx2(auVar27,0xc4);
  *(undefined1 (*) [32])
   ((__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5) =
       auVar27;
  auVar41 = vshufpd_avx(auVar17,auVar17,1);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       auVar41;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       adStack_4c8[6];
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementBeamANCF_3243::GetPK2Stress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}